

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall
QGraphicsAnchorLayoutPrivate::removeVertex
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *item,AnchorPoint edge)

{
  bool bVar1;
  AnchorVertex *pAVar2;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  const_iterator item_00;
  const_iterator o;
  AnchorVertex **ppAVar3;
  AnchorPoint in_EDX;
  AnchorVertex *in_RSI;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *in_RDI;
  long in_FS_OFFSET;
  AnchorVertex *v2;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *__range2;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *g;
  AnchorVertex *v;
  const_iterator __end2;
  const_iterator __begin2;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> allVertices;
  Orientation in_stack_ffffffffffffff7c;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *this_01;
  QGraphicsLayoutItem *in_stack_ffffffffffffff90;
  QGraphicsAnchorLayoutPrivate *in_stack_ffffffffffffff98;
  QGraphicsAnchorLayoutPrivate *this_02;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 local_20 [16];
  QGraphicsLayoutItem *local_10;
  QSizeF *local_8;
  
  local_8 = *(QSizeF **)(in_FS_OFFSET + 0x28);
  pAVar2 = internalVertex(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          (AnchorPoint)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
  if (pAVar2 != (AnchorVertex *)0x0) {
    this_01 = (QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)(in_RDI + 0x2e);
    edgeOrientation(in_EDX);
    this_00 = QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
              ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                            *)this_01,in_stack_ffffffffffffff7c);
    local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = (QGraphicsLayoutItem *)&DAT_aaaaaaaaaaaaaaaa;
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
    adjacentVertices(in_RDI,in_RSI);
    this_02 = (QGraphicsAnchorLayoutPrivate *)local_20;
    item_00 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::begin(this_01);
    o = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::end(this_01);
    while( true ) {
      bVar1 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator!=
                        ((const_iterator *)&stack0xffffffffffffffd8,o);
      if (!bVar1) break;
      ppAVar3 = QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator*
                          ((const_iterator *)&stack0xffffffffffffffd8);
      Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::removeEdge
                (this_00,(AnchorVertex *)this_02,*ppAVar3);
      removeInternalVertex
                (this_02,(QGraphicsLayoutItem *)item_00.i,(AnchorPoint)((ulong)o.i >> 0x20));
      removeInternalVertex
                (this_02,(QGraphicsLayoutItem *)item_00.i,(AnchorPoint)((ulong)o.i >> 0x20));
      QList<QtGraphicsAnchorLayout::AnchorVertex_*>::const_iterator::operator++
                ((const_iterator *)&stack0xffffffffffffffd8);
    }
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::~QList
              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x93e2fc);
  }
  if (*(QSizeF **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeVertex(QGraphicsLayoutItem *item, Qt::AnchorPoint edge)
{
    if (AnchorVertex *v = internalVertex(item, edge)) {
        Graph<AnchorVertex, AnchorData> &g = graph[edgeOrientation(edge)];
        const auto allVertices = g.adjacentVertices(v);
        for (auto *v2 : allVertices) {
            g.removeEdge(v, v2);
            removeInternalVertex(item, edge);
            removeInternalVertex(v2->m_item, v2->m_edge);
        }
    }
}